

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void VW::save_predictor(vw *all,string *reg_name)

{
  string *in_RSI;
  undefined1 in_stack_000002c7;
  string *in_stack_000002c8;
  vw *in_stack_000002d0;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  dump_regressor(in_stack_000002d0,in_stack_000002c8,(bool)in_stack_000002c7);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void save_predictor(vw& all, string reg_name) { dump_regressor(all, reg_name, false); }